

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockUnix.cxx
# Opt level: O2

int __thiscall cmFileLock::LockFile(cmFileLock *this,int cmd,int type)

{
  int iVar1;
  undefined2 local_20;
  undefined2 local_1e;
  undefined8 local_18;
  undefined8 uStack_10;
  undefined4 local_8;
  
  local_18 = 0;
  uStack_10 = 0;
  local_8 = 0;
  local_20 = (undefined2)type;
  local_1e = 0;
  iVar1 = fcntl64(this->File,cmd,&local_20);
  return iVar1;
}

Assistant:

int cmFileLock::LockFile(int cmd, int type)
{
  struct ::flock lock;
  lock.l_start = 0;
  lock.l_len = 0;                         // lock all bytes
  lock.l_pid = 0;                         // unused (for F_GETLK only)
  lock.l_type = static_cast<short>(type); // exclusive lock
  lock.l_whence = SEEK_SET;
  return ::fcntl(this->File, cmd, &lock);
}